

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorSet.cpp
# Opt level: O1

void __thiscall
myvk::DescriptorSet::UpdateStorageBuffer
          (DescriptorSet *this,Ptr<BufferBase> *buffer,uint32_t binding,uint32_t array_element,
          VkDeviceSize offset,VkDeviceSize range)

{
  PFN_vkUpdateDescriptorSets p_Var1;
  int iVar2;
  undefined4 extraout_var;
  VkDescriptorBufferInfo info;
  VkWriteDescriptorSet write;
  VkDescriptorBufferInfo local_78;
  VkWriteDescriptorSet local_58;
  
  p_Var1 = vkUpdateDescriptorSets;
  local_58.pBufferInfo = &local_78;
  local_78.buffer =
       ((buffer->super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_buffer
  ;
  local_58.pNext = (void *)0x0;
  local_58.pTexelBufferView = (VkBufferView *)0x0;
  local_58.pImageInfo = (VkDescriptorImageInfo *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
  local_58._4_4_ = 0;
  local_58.dstSet = this->m_descriptor_set;
  local_58.dstArrayElement = array_element;
  local_58.dstBinding = binding;
  local_58.descriptorCount = 1;
  local_58.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
  local_78.offset = offset;
  local_78.range = range;
  iVar2 = (*(this->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  (*p_Var1)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar2) + 0x268),1,&local_58,0,
            (VkCopyDescriptorSet *)0x0);
  return;
}

Assistant:

void DescriptorSet::UpdateStorageBuffer(const Ptr<BufferBase> &buffer, uint32_t binding, uint32_t array_element,
                                        VkDeviceSize offset, VkDeviceSize range) const {
	VkDescriptorBufferInfo info = {};
	info.buffer = buffer->GetHandle();
	info.range = range;
	info.offset = offset;

	VkWriteDescriptorSet write = {};
	write.sType = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
	write.dstSet = m_descriptor_set;
	write.dstBinding = binding;
	write.dstArrayElement = array_element;
	write.descriptorType = VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
	write.descriptorCount = 1;
	write.pBufferInfo = &info;

	vkUpdateDescriptorSets(GetDevicePtr()->GetHandle(), 1, &write, 0, nullptr);
}